

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

void __thiscall
Js::Utf8SourceInfo::Utf8SourceInfo
          (Utf8SourceInfo *this,ISourceHolder *mappableSource,int32 cchLength,SRCINFO *srcInfo,
          DWORD_PTR secondaryHostSourceContext,ScriptContext *scriptContext,bool isLibraryCode,
          Var scriptSource)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Type *addr_02;
  Type *addr_03;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type TVar2;
  
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014dd0c8;
  this->m_cchLength = cchLength;
  addr = &this->sourceHolder;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->sourceHolder).ptr = mappableSource;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->topLevelFunctionInfoList).ptr =
       (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  (this->functionBodyDictionary).ptr =
       (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  (this->m_deferredFunctionsDictionary).ptr =
       (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->boundedPropertyRecordHashSet).
                    super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,scriptContext->recycler,0);
  (this->m_debugDocument).ptr = (DebugDocument *)0x0;
  addr_00 = &this->m_srcInfo;
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = srcInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  this->m_secondaryHostSourceContext = secondaryHostSourceContext;
  addr_01 = &this->m_scriptContext;
  (this->debugModeSource).ptr = (uchar *)0x0;
  this->debugModeSourceLength = 0;
  Memory::Recycler::WBSetBit((char *)addr_01);
  addr_01->ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  (this->m_lineOffsetCache).ptr = (LineOffsetCache *)0x0;
  (this->callerUtf8SourceInfo).ptr = (Utf8SourceInfo *)0x0;
  this->field_0xa8 = this->field_0xa8 & 0x80 | isLibraryCode << 2;
  TVar2 = scriptContext->threadContext->sourceInfoCount + 1;
  scriptContext->threadContext->sourceInfoCount = TVar2;
  this->m_sourceInfoId = TVar2;
  addr_02 = &this->sourceRef;
  Memory::Recycler::WBSetBit((char *)addr_02);
  addr_02->ptr = scriptSource;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
  iVar1 = (*(addr->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(addr->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(addr->ptr,L"Entering Debug Mode");
    addr_03 = &this->debugModeSource;
    Memory::Recycler::WBSetBit((char *)addr_03);
    addr_03->ptr = (uchar *)CONCAT44(extraout_var,iVar1);
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_03);
    iVar1 = (*(addr->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(addr->ptr,L"Entering Debug Mode");
    this->debugModeSourceLength = CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*(((this->sourceHolder).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[10])();
    this->field_0xa8 =
         this->field_0xa8 & 0xdf | ((byte)iVar1 | (this->debugModeSource).ptr == (uchar *)0x0) << 5;
  }
  return;
}

Assistant:

Utf8SourceInfo::Utf8SourceInfo(ISourceHolder* mappableSource, int32 cchLength,
        SRCINFO const* srcInfo, DWORD_PTR secondaryHostSourceContext,
        ScriptContext* scriptContext, bool isLibraryCode, Js::Var scriptSource):
        sourceHolder(mappableSource),
        m_cchLength(cchLength),
        m_srcInfo(srcInfo),
        m_secondaryHostSourceContext(secondaryHostSourceContext),
#ifdef ENABLE_SCRIPT_DEBUGGING
        m_debugDocument(nullptr),
#endif
        m_sourceInfoId(scriptContext->GetThreadContext()->NewSourceInfoNumber()),
        m_isCesu8(false),
        m_isLibraryCode(isLibraryCode),
        m_isXDomain(false),
        m_isXDomainString(false),
        m_scriptContext(scriptContext),
        m_lineOffsetCache(nullptr),
        m_deferredFunctionsDictionary(nullptr),
        m_deferredFunctionsInitialized(false),
        topLevelFunctionInfoList(nullptr),
#ifdef ENABLE_SCRIPT_DEBUGGING
        debugModeSource(nullptr),
        debugModeSourceIsEmpty(false),
        debugModeSourceLength(0),
        m_isInDebugMode(false),
#endif
        callerUtf8SourceInfo(nullptr),
        boundedPropertyRecordHashSet(scriptContext->GetRecycler())
#ifndef NTBUILD
        ,sourceRef(scriptSource)
#endif
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!sourceHolder->IsDeferrable())
        {
            this->debugModeSource = this->sourceHolder->GetSource(_u("Entering Debug Mode"));
            this->debugModeSourceLength = this->sourceHolder->GetByteLength(_u("Entering Debug Mode"));
            this->debugModeSourceIsEmpty = !this->HasSource() || this->debugModeSource == nullptr;
        }
#endif
    }